

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O1

void __thiscall
CPubKey::
Set<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (CPubKey *this,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          pbegin,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 pend)

{
  byte bVar1;
  long lVar2;
  byte bVar3;
  size_t __n;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (pend._M_current != pbegin._M_current) {
    bVar1 = *pbegin._M_current;
    __n = 0x21;
    bVar3 = 1;
    if (((bVar1 & 0xfe) == 2) || ((bVar1 < 8 && (__n = 0x41, (0xd0U >> (bVar1 & 0x1f) & 1) != 0))))
    goto LAB_00495f82;
  }
  bVar3 = 0;
  __n = 0;
LAB_00495f82:
  if ((bool)(bVar3 ^ 1) || (long)pend._M_current - (long)pbegin._M_current != __n) {
    this->vch[0] = 0xff;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    memcpy(this,pbegin._M_current,__n);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Set(const T pbegin, const T pend)
    {
        int len = pend == pbegin ? 0 : GetLen(pbegin[0]);
        if (len && len == (pend - pbegin))
            memcpy(vch, (unsigned char*)&pbegin[0], len);
        else
            Invalidate();
    }